

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessesView.cpp
# Opt level: O2

int __thiscall ProcessesView::getRowIndexByPid(ProcessesView *this,QString *pid)

{
  bool bVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  int iVar5;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  anon_union_24_3_e3d07ef4_for_data local_80;
  undefined1 local_60 [24];
  QString row_pid;
  
  iVar5 = 0;
  while( true ) {
    plVar3 = (long *)QAbstractItemView::model();
    local_80._forAlignment = -NAN;
    local_80._8_8_ = 0;
    local_80._16_8_ = 0;
    iVar2 = (**(code **)(*plVar3 + 0x78))(plVar3,&local_80);
    if (iVar2 <= iVar5) {
      return -1;
    }
    plVar3 = (long *)QAbstractItemView::model();
    plVar4 = (long *)QAbstractItemView::model();
    local_98 = 0xffffffffffffffff;
    local_90 = 0;
    uStack_88 = 0;
    (**(code **)(*plVar4 + 0x60))(local_60,plVar4,iVar5,3,&local_98);
    (**(code **)(*plVar3 + 0x90))(&local_80,plVar3,local_60,0);
    QVariant::toString();
    QVariant::~QVariant((QVariant *)&local_80);
    bVar1 = operator==((QString *)&row_pid.d,pid);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&row_pid.d);
    if (bVar1) break;
    iVar5 = iVar5 + 1;
  }
  return iVar5;
}

Assistant:

int ProcessesView::getRowIndexByPid(const QString &pid) {
    for (int i = 0; i < model()->rowCount(); i++) {
        QString row_pid = model()->data(model()->index(i, NVSMColumns::PID)).toString();

        if (row_pid == pid) {
            return i;
        }
    }

    return -1;
}